

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolov3detectionoutput_x86_fma.cpp
# Opt level: O3

int __thiscall
ncnn::Yolov3DetectionOutput_x86_fma::forward
          (Yolov3DetectionOutput_x86_fma *this,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  float *pfVar1;
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>
  *this_00;
  void *pvVar2;
  size_t sVar3;
  iterator __position;
  Mat *this_01;
  undefined1 auVar4 [12];
  undefined1 auVar5 [12];
  undefined8 uVar6;
  undefined8 uVar7;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *pvVar8;
  int iVar9;
  int iVar10;
  float *pfVar11;
  undefined4 *puVar12;
  long lVar13;
  undefined4 uVar14;
  int iVar15;
  BBoxRect *__args;
  float *pfVar16;
  pointer pMVar17;
  long in_R9;
  float *pfVar18;
  long lVar19;
  float *pfVar20;
  ulong uVar21;
  uint _h;
  float fVar22;
  float fVar23;
  undefined4 extraout_XMM0_Db;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 extraout_var [60];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar32 [16];
  undefined1 auVar35 [64];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 in_register_00001304 [12];
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  bbox_rects;
  vector<unsigned_long,_std::allocator<unsigned_long>_> picked;
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  all_bbox_rects;
  vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
  local_198;
  ulong local_178;
  long local_170;
  BBoxRect local_168;
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  local_148;
  undefined1 local_128 [16];
  long local_118;
  long local_110;
  float *local_108;
  float *local_100;
  Yolov3DetectionOutput *local_f8;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_f0;
  Option *local_e8;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_e0;
  pointer local_d8;
  long local_d0;
  long local_c8;
  void *local_c0;
  long local_b8;
  void *local_b0;
  float *local_a8;
  long local_a0;
  undefined1 local_98 [16];
  undefined1 local_88 [8];
  float fStack_80;
  float fStack_7c;
  undefined1 local_78 [8];
  float fStack_70;
  float fStack_6c;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  float local_48;
  undefined4 uStack_44;
  
  local_148.
  super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_148.
  super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_148.
  super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_f0 = top_blobs;
  local_e8 = opt;
  if ((bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
      super__Vector_impl_data._M_finish !=
      (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
      super__Vector_impl_data._M_start) {
    local_178 = 0;
    local_f8 = &this->super_Yolov3DetectionOutput;
    local_e0 = bottom_blobs;
    do {
      pvVar8 = local_e0;
      local_198.
      super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_198.
      super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_198.
      super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
      ::resize(&local_198,(long)(this->super_Yolov3DetectionOutput).num_box);
      pMVar17 = (pvVar8->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      iVar10 = (this->super_Yolov3DetectionOutput).num_box;
      iVar9 = pMVar17[local_178].c / iVar10;
      if (iVar9 != (this->super_Yolov3DetectionOutput).num_class + 5) {
        std::
        vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
        ::~vector(&local_198);
        iVar10 = -1;
        goto LAB_0044b0e8;
      }
      if (0 < iVar10) {
        pMVar17 = pMVar17 + local_178;
        uVar21._0_4_ = pMVar17->w;
        uVar21._4_4_ = pMVar17->h;
        auVar24._8_8_ = 0;
        auVar24._0_8_ = uVar21;
        auVar26 = vcvtdq2ps_avx(auVar24);
        pvVar2 = (this->super_Yolov3DetectionOutput).anchors_scale.data;
        fVar22 = *(float *)((long)pvVar2 + local_178 * 4);
        uVar14 = vextractps_avx(auVar24,1);
        local_118 = CONCAT44((int)((ulong)pvVar2 >> 0x20),uVar14);
        auVar36._0_4_ = fVar22 * auVar26._0_4_;
        auVar36._4_4_ = fVar22 * auVar26._4_4_;
        auVar36._8_4_ = fVar22 * auVar26._8_4_;
        auVar36._12_4_ = fVar22 * auVar26._12_4_;
        in_R9 = CONCAT44((int)((ulong)in_R9 >> 0x20),(undefined4)uVar21);
        local_98 = vroundps_avx(auVar36,0xb);
        local_d0 = (long)iVar9;
        auVar25._0_12_ = ZEXT412(0x3f000000) << 0x40;
        auVar25._12_4_ = 0x3f000000;
        local_78 = auVar26._0_8_;
        register0x00001248 = auVar25._8_8_;
        auVar26._8_4_ = 0x3f800000;
        auVar26._0_8_ = 0x3f8000003f800000;
        auVar26._12_4_ = 0x3f800000;
        _local_88 = vdivps_avx(auVar26,_local_78);
        local_c8 = (long)iVar10 * local_178 * 4;
        local_170 = 0;
        local_110 = in_R9;
        local_d8 = pMVar17;
        do {
          uVar21 = pMVar17->elemsize;
          if (0 < (int)local_118) {
            lVar19 = local_170 * local_d0;
            sVar3 = pMVar17->cstep;
            pvVar2 = pMVar17->data;
            local_c0 = (void *)((lVar19 + 5) * sVar3 * uVar21 + (long)pvVar2);
            auVar27._8_8_ = 0;
            auVar27._0_8_ =
                 *(ulong *)((long)(this->super_Yolov3DetectionOutput).biases.data +
                           (long)((int)*(float *)((long)(this->super_Yolov3DetectionOutput).mask.
                                                        data + local_170 * 4 + local_c8) * 2) * 4);
            pfVar18 = (float *)((lVar19 + 4) * sVar3 * uVar21 + (long)pvVar2);
            local_100 = (float *)((lVar19 + 3) * sVar3 * uVar21 + (long)pvVar2);
            local_108 = (float *)((lVar19 + 2) * sVar3 * uVar21 + (long)pvVar2);
            pfVar16 = (float *)((lVar19 + 1) * sVar3 * uVar21 + (long)pvVar2);
            pfVar20 = (float *)(lVar19 * sVar3 * uVar21 + (long)pvVar2);
            iVar10 = (int)(((long)pMVar17->d * uVar21 * (long)pMVar17->h * (long)pMVar17->w + 0xf &
                           0xfffffffffffffff0) / uVar21);
            auVar32._8_4_ = 0x3f800000;
            auVar32._0_8_ = 0x3f8000003f800000;
            auVar32._12_4_ = 0x3f800000;
            local_68 = vmovlhps_avx(auVar32,auVar27);
            local_a0 = (long)iVar10;
            lVar19 = 0;
            do {
              local_b8 = lVar19;
              if (0 < (int)in_R9) {
                auVar28._0_4_ = (float)(int)lVar19;
                auVar28._4_12_ = in_register_00001304;
                local_b0 = (void *)((long)local_c0 + lVar19 * in_R9 * 4);
                local_58 = vshufps_avx(auVar28,local_98,0x40);
                lVar19 = 0;
                do {
                  lVar13 = (this->super_Yolov3DetectionOutput).num_class * local_a0;
                  if ((int)lVar13 < 1) {
                    iVar9 = 0;
                    local_128 = SUB6416(ZEXT464(0xff7fffff),0);
                  }
                  else {
                    pfVar11 = (float *)((long)local_b0 + lVar19 * 4);
                    pfVar1 = pfVar11 + lVar13;
                    iVar9 = 0;
                    auVar35 = ZEXT464(0xff7fffff);
                    iVar15 = 0;
                    do {
                      if (auVar35._0_4_ < *pfVar11) {
                        iVar9 = iVar15;
                      }
                      local_128 = vmaxss_avx(ZEXT416((uint)*pfVar11),auVar35._0_16_);
                      auVar35 = ZEXT1664(local_128);
                      pfVar11 = pfVar11 + iVar10;
                      iVar15 = iVar15 + 1;
                    } while (pfVar11 < pfVar1);
                  }
                  fVar22 = expf(-*pfVar18);
                  fVar23 = expf(-(float)local_128._0_4_);
                  auVar26 = vfmadd132ss_fma(ZEXT416((uint)(fVar23 + 1.0)),
                                            SUB6416(ZEXT464(0x3f800000),0),ZEXT416((uint)fVar22));
                  fVar22 = 1.0 / auVar26._0_4_;
                  if (local_f8->confidence_threshold <= fVar22) {
                    local_a8 = pfVar18;
                    fVar23 = expf(-*pfVar20);
                    local_128 = ZEXT416((uint)(fVar23 + 1.0));
                    fVar23 = expf(-*pfVar16);
                    local_128 = vinsertps_avx(local_128,ZEXT416((uint)(fVar23 + 1.0)),0x10);
                    local_48 = expf(*local_108);
                    uStack_44 = extraout_XMM0_Db;
                    auVar35._0_4_ = expf(*local_100);
                    auVar35._4_60_ = extraout_var;
                    auVar33._8_8_ = CONCAT44(uStack_44,local_48);
                    auVar33._0_8_ = CONCAT44(uStack_44,local_48);
                    auVar24 = vinsertps_avx(auVar33,auVar35._0_16_,0x30);
                    auVar26 = vdivps_avx(local_68,local_128);
                    auVar37._0_4_ = (float)(int)lVar19;
                    auVar37._4_12_ = local_58._4_12_;
                    auVar4._4_8_ = auVar24._8_8_;
                    auVar4._0_4_ = local_68._4_4_ * auVar24._4_4_;
                    auVar29._0_8_ = auVar4._0_8_ << 0x20;
                    auVar29._8_4_ = local_68._8_4_ * auVar24._8_4_;
                    auVar29._12_4_ = local_68._12_4_ * auVar24._12_4_;
                    auVar30._8_8_ = auVar29._8_8_;
                    auVar30._0_8_ = auVar26._0_8_;
                    auVar34._0_4_ = (auVar26._0_4_ + auVar37._0_4_) * (float)local_88._0_4_;
                    auVar34._4_4_ = (auVar26._4_4_ + local_58._4_4_) * (float)local_88._4_4_;
                    auVar34._8_4_ = (auVar26._8_4_ + local_58._8_4_) * fStack_80;
                    auVar34._12_4_ = (auVar26._12_4_ + local_58._12_4_) * fStack_7c;
                    auVar26 = vdivps_avx(auVar30,auVar37);
                    auVar38._0_4_ = auVar26._0_4_ * (float)local_78._0_4_;
                    auVar38._4_4_ = auVar26._4_4_ * (float)local_78._4_4_;
                    auVar38._8_4_ = auVar26._8_4_ * fStack_70;
                    auVar38._12_4_ = auVar26._12_4_ * fStack_6c;
                    auVar24 = vshufpd_avx(auVar38,auVar34,1);
                    auVar25 = vsubps_avx(auVar34,auVar24);
                    auVar5._4_8_ = auVar38._8_8_;
                    auVar5._0_4_ = auVar38._4_4_ + auVar24._4_4_;
                    auVar39._0_8_ = auVar5._0_8_ << 0x20;
                    auVar39._8_4_ = auVar38._8_4_ + auVar24._8_4_;
                    auVar39._12_4_ = auVar38._12_4_ + auVar24._12_4_;
                    auVar24 = vmovshdup_avx(auVar26);
                    auVar31._0_4_ = auVar24._0_4_ * auVar26._0_4_;
                    auVar31._4_4_ = auVar24._4_4_ * auVar26._4_4_;
                    auVar31._8_4_ = auVar24._8_4_ * auVar26._8_4_;
                    auVar31._12_4_ = auVar24._12_4_ * auVar26._12_4_;
                    local_168.xmin = auVar25._0_4_;
                    local_168.ymin = auVar25._4_4_;
                    local_168.area = (float)vextractps_avx(auVar31,2);
                    this_00 = (vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>
                               *)(local_198.
                                  super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + local_170);
                    __position._M_current = *(BBoxRect **)(this_00 + 8);
                    local_168.score = fVar22;
                    local_168.xmax = auVar39._8_4_;
                    local_168.ymax = auVar39._12_4_;
                    local_168.label = iVar9;
                    if (__position._M_current == *(BBoxRect **)(this_00 + 0x10)) {
                      std::
                      vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>
                      ::_M_realloc_insert<ncnn::Yolov3DetectionOutput::BBoxRect_const&>
                                (this_00,__position,&local_168);
                      pfVar18 = local_a8;
                    }
                    else {
                      (__position._M_current)->xmax = (float)(int)auVar39._8_8_;
                      (__position._M_current)->ymax = (float)(int)((ulong)auVar39._8_8_ >> 0x20);
                      (__position._M_current)->area = local_168.area;
                      (__position._M_current)->label = iVar9;
                      (__position._M_current)->score = fVar22;
                      (__position._M_current)->xmin = local_168.xmin;
                      (__position._M_current)->ymin = local_168.ymin;
                      (__position._M_current)->xmax = auVar39._8_4_;
                      *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 0x1c;
                      pfVar18 = local_a8;
                    }
                  }
                  pfVar20 = pfVar20 + 1;
                  pfVar16 = pfVar16 + 1;
                  local_108 = local_108 + 1;
                  local_100 = local_100 + 1;
                  pfVar18 = pfVar18 + 1;
                  lVar19 = lVar19 + 1;
                  this = (Yolov3DetectionOutput_x86_fma *)local_f8;
                } while (lVar19 != local_110);
              }
              lVar19 = local_b8 + 1;
              in_R9 = local_110;
            } while (lVar19 != local_118);
            iVar10 = (this->super_Yolov3DetectionOutput).num_box;
            pMVar17 = local_d8;
          }
          local_170 = local_170 + 1;
        } while (local_170 < iVar10);
        if (0 < iVar10) {
          lVar19 = 8;
          lVar13 = 0;
          do {
            std::
            vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>
            ::
            _M_range_insert<__gnu_cxx::__normal_iterator<ncnn::Yolov3DetectionOutput::BBoxRect_const*,std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>>>
                      ((vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>
                        *)&local_148,
                       local_148.
                       super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                       ._M_impl.super__Vector_impl_data._M_finish,
                       *(undefined8 *)
                        ((long)local_198.
                               super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + lVar19 + -8),
                       *(undefined8 *)
                        ((long)&((local_198.
                                  super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->
                                super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                                )._M_impl.super__Vector_impl_data._M_start + lVar19));
            lVar13 = lVar13 + 1;
            lVar19 = lVar19 + 0x18;
          } while (lVar13 < (this->super_Yolov3DetectionOutput).num_box);
        }
      }
      std::
      vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
      ::~vector(&local_198);
      local_178 = local_178 + 1;
    } while (local_178 <
             (ulong)(((long)(local_e0->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)(local_e0->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                            _M_impl.super__Vector_impl_data._M_start >> 3) * -0x71c71c71c71c71c7));
  }
  Yolov3DetectionOutput::qsort_descent_inplace(&this->super_Yolov3DetectionOutput,&local_148);
  local_168.score = 0.0;
  local_168.xmin = 0.0;
  local_168.ymin = 0.0;
  local_168.xmax = 0.0;
  local_168.ymax = 0.0;
  local_168.area = 0.0;
  Yolov3DetectionOutput::nms_sorted_bboxes
            (&this->super_Yolov3DetectionOutput,&local_148,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_168,
             (this->super_Yolov3DetectionOutput).nms_threshold);
  local_198.
  super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_198.
  super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_198.
  super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar19 = CONCAT44(local_168.xmin,local_168.score);
  lVar13 = CONCAT44(local_168.xmax,local_168.ymin);
  if (lVar13 == lVar19) {
    iVar10 = 0;
  }
  else {
    uVar21 = 0;
    do {
      __args = local_148.
               super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
               ._M_impl.super__Vector_impl_data._M_start + *(long *)(lVar19 + uVar21 * 8);
      if (local_198.
          super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          local_198.
          super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>
        ::_M_realloc_insert<ncnn::Yolov3DetectionOutput::BBoxRect_const&>
                  ((vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>
                    *)&local_198,
                   (iterator)
                   local_198.
                   super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish,__args);
        lVar19 = CONCAT44(local_168.xmin,local_168.score);
        lVar13 = CONCAT44(local_168.xmax,local_168.ymin);
      }
      else {
        uVar6 = *(undefined8 *)__args;
        uVar7 = *(undefined8 *)&__args->ymin;
        *(undefined1 (*) [16])
         ((long)local_198.
                super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish + 0xc) =
             *(undefined1 (*) [16])&__args->xmax;
        *(undefined8 *)
         local_198.
         super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish = uVar6;
        *(undefined8 *)
         ((long)local_198.
                super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish + 8) = uVar7;
        local_198.
        super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             (pointer)((long)local_198.
                             super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish + 0x1c);
      }
      uVar21 = uVar21 + 1;
    } while (uVar21 < (ulong)(lVar13 - lVar19 >> 3));
    _h = (int)((long)local_198.
                     super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_198.
                     super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x49249249;
    iVar10 = 0;
    if (_h != 0) {
      this_01 = (local_f0->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      Mat::create(this_01,6,_h,4,local_e8->blob_allocator);
      iVar10 = -100;
      if (((this_01->data != (void *)0x0) && ((long)this_01->c * this_01->cstep != 0)) &&
         (iVar10 = 0, 0 < (int)_h)) {
        iVar9 = this_01->w;
        sVar3 = this_01->elemsize;
        puVar12 = (undefined4 *)((long)this_01->data + 0x14);
        iVar10 = 0;
        lVar19 = 0;
        do {
          uVar14 = *(undefined4 *)
                    ((long)&((local_198.
                              super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->
                            super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                            )._M_impl.super__Vector_impl_data._M_start + lVar19);
          puVar12[-5] = (float)*(int *)((long)&local_198.
                                               super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start[1].
                                               super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                                               ._M_impl.super__Vector_impl_data._M_start + lVar19) +
                        1.0;
          puVar12[-4] = uVar14;
          puVar12[-3] = *(undefined4 *)
                         ((long)&((local_198.
                                   super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->
                                 super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                                 )._M_impl.super__Vector_impl_data._M_start + lVar19 + 4);
          puVar12[-2] = *(undefined4 *)
                         ((long)&((local_198.
                                   super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->
                                 super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                                 )._M_impl.super__Vector_impl_data._M_finish + lVar19);
          puVar12[-1] = *(undefined4 *)
                         ((long)&((local_198.
                                   super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->
                                 super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                                 )._M_impl.super__Vector_impl_data._M_finish + lVar19 + 4);
          *puVar12 = *(undefined4 *)
                      ((long)&((local_198.
                                super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->
                              super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                              )._M_impl.super__Vector_impl_data._M_end_of_storage + lVar19);
          lVar19 = lVar19 + 0x1c;
          puVar12 = (undefined4 *)((long)puVar12 + (long)iVar9 * sVar3);
        } while ((ulong)(_h & 0x7fffffff) * 0x1c != lVar19);
      }
    }
  }
  if (local_198.
      super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_198.
                    super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_198.
                          super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_198.
                          super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  pvVar2 = (void *)CONCAT44(local_168.xmin,local_168.score);
  if (pvVar2 != (void *)0x0) {
    operator_delete(pvVar2,CONCAT44(local_168.area,local_168.ymax) - (long)pvVar2);
  }
LAB_0044b0e8:
  if (local_148.
      super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_148.
                    super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_148.
                          super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_148.
                          super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return iVar10;
}

Assistant:

int Yolov3DetectionOutput_x86_fma::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    // gather all box
    std::vector<BBoxRect> all_bbox_rects;

    for (size_t b = 0; b < bottom_blobs.size(); b++)
    {
        std::vector<std::vector<BBoxRect> > all_box_bbox_rects;
        all_box_bbox_rects.resize(num_box);
        const Mat& bottom_top_blobs = bottom_blobs[b];

        int w = bottom_top_blobs.w;
        int h = bottom_top_blobs.h;
        int channels = bottom_top_blobs.c;
        //printf("%d %d %d\n", w, h, channels);
        const int channels_per_box = channels / num_box;

        // anchor coord + box score + num_class
        if (channels_per_box != 4 + 1 + num_class)
            return -1;
        size_t mask_offset = b * num_box;
        int net_w = (int)(anchors_scale[b] * w);
        int net_h = (int)(anchors_scale[b] * h);
//printf("%d %d\n", net_w, net_h);

//printf("%d %d %d\n", w, h, channels);
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int pp = 0; pp < num_box; pp++)
        {
            int p = pp * channels_per_box;
            int biases_index = static_cast<int>(mask[pp + mask_offset]);
            //printf("%d\n", biases_index);
            const float bias_w = biases[biases_index * 2];
            const float bias_h = biases[biases_index * 2 + 1];
            //printf("%f %f\n", bias_w, bias_h);
            const float* xptr = bottom_top_blobs.channel(p);
            const float* yptr = bottom_top_blobs.channel(p + 1);
            const float* wptr = bottom_top_blobs.channel(p + 2);
            const float* hptr = bottom_top_blobs.channel(p + 3);

            const float* box_score_ptr = bottom_top_blobs.channel(p + 4);

            // softmax class scores
            Mat scores = bottom_top_blobs.channel_range(p + 5, num_class);
            //softmax->forward_inplace(scores, opt);

            const int cs = (int)scores.cstep;

#if __AVX2__
            const __m256i vi = _mm256_setr_epi32(
                                   0, cs * 1, cs * 2, cs * 3, cs * 4, cs * 5, cs * 6, cs * 7);
#endif

            for (int i = 0; i < h; i++)
            {
                for (int j = 0; j < w; j++)
                {
#if 0
                    int class_index = 0;
                    float class_score = -FLT_MAX;
                    for (int q = 0; q < num_class; q++)
                    {
                        float score = scores.channel(q).row(i)[j];
                        if (score > class_score)
                        {
                            class_index = q;
                            class_score = score;
                        }
                    }
#else
                    // find class index with max class score
                    int class_index = 0;
                    float class_score = -FLT_MAX;
                    float* ptr = ((float*)scores.data) + i * w + j;
                    float* end = ptr + num_class * cs;
                    int q = 0;
#if __AVX2__
                    float* end8 = ptr + (num_class & -8) * cs;
                    unsigned long index;

                    for (; ptr < end8; ptr += 8 * cs, q += 8)
                    {
                        __m256 p = _mm256_i32gather_ps(ptr, vi, 4);
                        __m256 t = _mm256_max_ps(p, _mm256_permute2f128_ps(p, p, 1));
                        t = _mm256_max_ps(t, _mm256_permute_ps(t, 0x4e));
                        t = _mm256_max_ps(t, _mm256_permute_ps(t, 0xb1));
                        float score = _mm_cvtss_f32(_mm256_extractf128_ps(t, 0));

                        if (score > class_score)
                        {
                            __m256 mi = _mm256_cmp_ps(p, t, _CMP_EQ_OQ);
                            int mask = _mm256_movemask_ps(mi);
#ifdef _MSC_VER
                            BitScanForward(&index, mask);
#else
                            index = __builtin_ctz(mask);
#endif
                            class_index = q + index;
                            class_score = score;
                        }
                    }
#endif

                    for (; ptr < end; ptr += cs, q++)
                    {
                        if (*ptr > class_score)
                        {
                            class_index = q;
                            class_score = *ptr;
                        }
                    }
#endif
                    //sigmoid(box_score) * sigmoid(class_score)
                    float confidence = 1.f / ((1.f + expf(-box_score_ptr[0]) * (1.f + expf(-class_score))));
                    if (confidence >= confidence_threshold)
                    {
                        // region box
                        float bbox_cx = (j + sigmoid(xptr[0])) / w;
                        float bbox_cy = (i + sigmoid(yptr[0])) / h;
                        float bbox_w = expf(wptr[0]) * bias_w / net_w;
                        float bbox_h = expf(hptr[0]) * bias_h / net_h;

                        float bbox_xmin = bbox_cx - bbox_w * 0.5f;
                        float bbox_ymin = bbox_cy - bbox_h * 0.5f;
                        float bbox_xmax = bbox_cx + bbox_w * 0.5f;
                        float bbox_ymax = bbox_cy + bbox_h * 0.5f;

                        float area = bbox_w * bbox_h;

                        BBoxRect c = {confidence, bbox_xmin, bbox_ymin, bbox_xmax, bbox_ymax, area, class_index};
                        all_box_bbox_rects[pp].push_back(c);
                    }

                    xptr++;
                    yptr++;
                    wptr++;
                    hptr++;

                    box_score_ptr++;
                }
            }
        }

        for (int i = 0; i < num_box; i++)
        {
            const std::vector<BBoxRect>& box_bbox_rects = all_box_bbox_rects[i];

            all_bbox_rects.insert(all_bbox_rects.end(), box_bbox_rects.begin(), box_bbox_rects.end());
        }
    }

    // global sort inplace
    qsort_descent_inplace(all_bbox_rects);

    // apply nms
    std::vector<size_t> picked;
    nms_sorted_bboxes(all_bbox_rects, picked, nms_threshold);

    // select
    std::vector<BBoxRect> bbox_rects;

    for (size_t i = 0; i < picked.size(); i++)
    {
        size_t z = picked[i];
        bbox_rects.push_back(all_bbox_rects[z]);
    }

    // fill result
    int num_detected = static_cast<int>(bbox_rects.size());
    if (num_detected == 0)
        return 0;

    Mat& top_blob = top_blobs[0];
    top_blob.create(6, num_detected, 4u, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    for (int i = 0; i < num_detected; i++)
    {
        const BBoxRect& r = bbox_rects[i];
        float score = r.score;
        float* outptr = top_blob.row(i);

        outptr[0] = r.label + 1.0f; // +1 for prepend background class
        outptr[1] = score;
        outptr[2] = r.xmin;
        outptr[3] = r.ymin;
        outptr[4] = r.xmax;
        outptr[5] = r.ymax;
    }

    return 0;
}